

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::TiledOutputFile::initialize(TiledOutputFile *this,Header *header)

{
  int maxX;
  int minY;
  int maxY;
  uint uVar1;
  pointer ppTVar2;
  LevelMode LVar3;
  LevelRoundingMode LVar4;
  bool bVar5;
  int iVar6;
  Format FVar7;
  LineOrder *pLVar8;
  TileDescription *pTVar9;
  Box2i *pBVar10;
  size_t sVar11;
  TileBuffer *pTVar12;
  Compression *pCVar13;
  Compressor *pCVar14;
  ulong uVar15;
  Data *pDVar16;
  TileOffsets TStack_58;
  
  Header::operator=(&this->_data->header,header);
  pLVar8 = Header::lineOrder(&this->_data->header);
  pDVar16 = this->_data;
  pDVar16->lineOrder = *pLVar8;
  pTVar9 = Header::tileDescription(&pDVar16->header);
  pDVar16 = this->_data;
  uVar1 = pTVar9->ySize;
  LVar3 = pTVar9->mode;
  LVar4 = pTVar9->roundingMode;
  (pDVar16->tileDesc).xSize = pTVar9->xSize;
  (pDVar16->tileDesc).ySize = uVar1;
  (pDVar16->tileDesc).mode = LVar3;
  (pDVar16->tileDesc).roundingMode = LVar4;
  bVar5 = Header::hasType(&this->_data->header);
  if (bVar5) {
    Header::setType(&this->_data->header,(string *)TILEDIMAGE_abi_cxx11_);
  }
  pBVar10 = Header::dataWindow(&this->_data->header);
  iVar6 = (pBVar10->min).x;
  pDVar16 = this->_data;
  pDVar16->minX = iVar6;
  maxX = (pBVar10->max).x;
  pDVar16->maxX = maxX;
  minY = (pBVar10->min).y;
  pDVar16->minY = minY;
  maxY = (pBVar10->max).y;
  pDVar16->maxY = maxY;
  precalculateTileInfo
            (&pDVar16->tileDesc,iVar6,maxX,minY,maxY,&pDVar16->numXTiles,&pDVar16->numYTiles,
             &pDVar16->numXLevels,&pDVar16->numYLevels);
  pDVar16 = this->_data;
  if (pDVar16->lineOrder == INCREASING_Y) {
    iVar6 = 0;
  }
  else {
    iVar6 = *pDVar16->numYTiles + -1;
  }
  (pDVar16->nextTileToWrite).dx = 0;
  (pDVar16->nextTileToWrite).dy = iVar6;
  (pDVar16->nextTileToWrite).lx = 0;
  (pDVar16->nextTileToWrite).ly = 0;
  sVar11 = calculateBytesPerPixel(&pDVar16->header);
  pDVar16 = this->_data;
  uVar1 = (pDVar16->tileDesc).ySize;
  sVar11 = (pDVar16->tileDesc).xSize * sVar11;
  pDVar16->maxBytesPerTileLine = sVar11;
  pDVar16->tileBufferSize = uVar1 * sVar11;
  for (uVar15 = 0;
      ppTVar2 = (pDVar16->tileBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar15 < (ulong)((long)(pDVar16->tileBuffers).
                             super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2 >> 3);
      uVar15 = uVar15 + 1) {
    pTVar12 = (TileBuffer *)operator_new(0x88);
    pCVar13 = Header::compression(&pDVar16->header);
    pDVar16 = this->_data;
    pCVar14 = newTileCompressor(*pCVar13,pDVar16->maxBytesPerTileLine,
                                (ulong)(pDVar16->tileDesc).ySize,&pDVar16->header);
    *(undefined8 *)((long)&pTVar12->buffer + 4) = 0;
    *(undefined8 *)&pTVar12->field_0x14 = 0;
    pTVar12->uncompressedData = (char *)0x0;
    pTVar12->buffer = (char *)0x0;
    *(Compressor **)&pTVar12->format = pCVar14;
    pTVar12->dy = 0;
    pTVar12->lx = 0;
    pTVar12->ly = 0;
    pTVar12->hasException = false;
    *(undefined3 *)&pTVar12->field_0x35 = 0;
    *(undefined1 *)&(pTVar12->exception)._M_dataplus._M_p = 0;
    (pTVar12->exception)._M_string_length = (size_type)((long)&(pTVar12->exception).field_2 + 8);
    (pTVar12->exception).field_2._M_allocated_capacity = 0;
    (pTVar12->exception).field_2._M_local_buf[8] = '\0';
    IlmThread_2_5::Semaphore::Semaphore((Semaphore *)&pTVar12->field_0x60,1);
    (this->_data->tileBuffers).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar15] = pTVar12;
    Array<char>::resizeErase
              ((Array<char> *)
               (this->_data->tileBuffers).
               super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15],this->_data->tileBufferSize);
    pDVar16 = this->_data;
  }
  FVar7 = defaultFormat(*(Compressor **)&(*ppTVar2)->format);
  pDVar16 = this->_data;
  pDVar16->format = FVar7;
  TileOffsets::TileOffsets
            (&TStack_58,(pDVar16->tileDesc).mode,pDVar16->numXLevels,pDVar16->numYLevels,
             pDVar16->numXTiles,pDVar16->numYTiles);
  TileOffsets::operator=(&this->_data->tileOffsets,&TStack_58);
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector(&TStack_58._offsets);
  return;
}

Assistant:

void
TiledOutputFile::initialize (const Header &header)
{
    _data->header = header;
    _data->lineOrder = _data->header.lineOrder();

    
    
    //
    // Check that the file is indeed tiled
    //

    _data->tileDesc = _data->header.tileDescription();

    
    //
    // 'Fix' the type attribute if it exists but is incorrectly set
    // (attribute is optional, but ensure it is correct if it exists)
    //
    if(_data->header.hasType())
    {
        _data->header.setType(TILEDIMAGE);
    }

    
    //
    // Save the dataWindow information
    //

    const Box2i &dataWindow = _data->header.dataWindow();
    _data->minX = dataWindow.min.x;
    _data->maxX = dataWindow.max.x;
    _data->minY = dataWindow.min.y;
    _data->maxY = dataWindow.max.y;

    //
    // Precompute level and tile information to speed up utility functions
    //

    precalculateTileInfo (_data->tileDesc,
			  _data->minX, _data->maxX,
			  _data->minY, _data->maxY,
			  _data->numXTiles, _data->numYTiles,
			  _data->numXLevels, _data->numYLevels);       
    
    //
    // Determine the first tile coordinate that we will be writing
    // if the file is not RANDOM_Y.
    //
    
    _data->nextTileToWrite = (_data->lineOrder == INCREASING_Y)?
			       TileCoord (0, 0, 0, 0):
			       TileCoord (0, _data->numYTiles[0] - 1, 0, 0);

    _data->maxBytesPerTileLine =
	    calculateBytesPerPixel (_data->header) * _data->tileDesc.xSize;

    _data->tileBufferSize = _data->maxBytesPerTileLine * _data->tileDesc.ySize;
     
    //
    // Create all the TileBuffers and allocate their internal buffers
    //

    for (size_t i = 0; i < _data->tileBuffers.size(); i++)
    {
        _data->tileBuffers[i] = new TileBuffer (newTileCompressor
						  (_data->header.compression(),
						   _data->maxBytesPerTileLine,
						   _data->tileDesc.ySize,
						   _data->header));

        _data->tileBuffers[i]->buffer.resizeErase(_data->tileBufferSize);
    }

    _data->format = defaultFormat (_data->tileBuffers[0]->compressor);

    _data->tileOffsets = TileOffsets (_data->tileDesc.mode,
				      _data->numXLevels,
				      _data->numYLevels,
				      _data->numXTiles,
				      _data->numYTiles);
}